

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QModelIndex *mi)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  QAbstractItemModel *pQVar3;
  undefined8 uVar4;
  Picker *this_00;
  long lVar5;
  QModelIndex local_68;
  QModelIndex local_48;
  
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  lVar5._0_4_ = this->modelColumn;
  if (mi->c != (int)lVar5) {
    pQVar2 = this->model;
    iVar1 = mi->r;
    pQVar3 = mi->m;
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x68))(&local_48,pQVar3,mi);
    }
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_68,pQVar2,iVar1,(int)lVar5,&local_48);
    if (((-1 < local_68.r) && (-1 < (long)local_68._0_8_)) &&
       (lVar5._0_4_ = local_68.r, local_68.m != (QAbstractItemModel *)0x0)) goto LAB_001717e4;
  }
  lVar5._0_4_ = mi->r;
  lVar5._4_4_ = mi->c;
  local_68.i = mi->i;
  local_68.m = mi->m;
  local_68._0_8_ = lVar5;
LAB_001717e4:
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->currentIndex);
  if (((local_48.r != (int)lVar5) || (local_48.i != local_68.i)) ||
     ((local_48.c != local_68.c || (local_48.m != local_68.m)))) {
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_48,&local_68);
    uVar4 = *(undefined8 *)&this->currentIndex;
    *(undefined8 *)&this->currentIndex = local_48._0_8_;
    local_48._0_8_ = uVar4;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_48);
    QWidget::update();
    this_00 = this->q;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->currentIndex);
    Picker::_q_emitCurrentIndexChanged(this_00,&local_48);
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QModelIndex & mi )
{
	QModelIndex normalized;

	if( mi.column() != modelColumn )
		normalized = model->index( mi.row(), modelColumn, mi.parent() );

	if( !normalized.isValid() )
		normalized = mi;    // Fallback to passed index.

	bool indexChanged = ( normalized != currentIndex );

	if( indexChanged )
	{
		currentIndex = QPersistentModelIndex( normalized );
		q->update();
		q->_q_emitCurrentIndexChanged( currentIndex );
	}
}